

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O0

bool __thiscall spvtools::opt::Edge::operator<(Edge *this,Edge *o)

{
  bool bVar1;
  uint32_t local_38;
  uint32_t local_34;
  pair<unsigned_int,_unsigned_int> local_30;
  uint32_t local_28;
  uint32_t local_24;
  pair<unsigned_int,_unsigned_int> local_20;
  Edge *local_18;
  Edge *o_local;
  Edge *this_local;
  
  local_18 = o;
  o_local = this;
  local_24 = BasicBlock::id(this->source);
  local_28 = BasicBlock::id(this->dest);
  local_20 = std::make_pair<unsigned_int,unsigned_int>(&local_24,&local_28);
  local_34 = BasicBlock::id(local_18->source);
  local_38 = BasicBlock::id(local_18->dest);
  local_30 = std::make_pair<unsigned_int,unsigned_int>(&local_34,&local_38);
  bVar1 = std::operator<(&local_20,&local_30);
  return bVar1;
}

Assistant:

bool operator<(const Edge& o) const {
    return std::make_pair(source->id(), dest->id()) <
           std::make_pair(o.source->id(), o.dest->id());
  }